

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O1

void __thiscall
raptor::Thread::Thread
          (Thread *this,char *thread_name,ThreadExecutor *thread_proc,void *arg,bool *success,
          Options *options)

{
  InternalThreadImpl *this_00;
  bool ret;
  bool local_59;
  bool *local_58;
  _Any_data local_50;
  code *local_40;
  
  local_59 = false;
  local_58 = success;
  this_00 = (InternalThreadImpl *)operator_new(0x70);
  std::function<void_(void_*)>::function((function<void_(void_*)> *)&local_50,thread_proc);
  InternalThreadImpl::InternalThreadImpl
            (this_00,thread_name,(ThreadExecutor *)&local_50,arg,&local_59,options);
  this->_impl = (IThreadService *)this_00;
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_59 == false) {
    this->_state = kFailed;
    if (this->_impl != (IThreadService *)0x0) {
      (*this->_impl->_vptr_IThreadService[1])();
    }
    this->_impl = (IThreadService *)0x0;
  }
  else {
    this->_state = kAlive;
  }
  if (local_58 != (bool *)0x0) {
    *local_58 = local_59;
  }
  return;
}

Assistant:

Thread::Thread(
    const char* thread_name,
    ThreadExecutor thread_proc, void* arg,
    bool* success, const Options& options) {
    bool ret = false;
    _impl = new InternalThreadImpl(thread_name, thread_proc, arg, &ret, options);
    if (!ret) {
        _state = kFailed;
        delete _impl;
        _impl = nullptr;
    } else {
        _state = kAlive;
    }
    if (success) {
        *success = ret;
    }
}